

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::rpc_session::prepare_handshake(rpc_session *this)

{
  element_type *peVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ptr<rpc_session> self;
  _Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
  local_88;
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> local_60;
  data_union local_50;
  address local_34;
  
  std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::rpc_session,void>
            ((__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            ((endpoint_type *)&local_50.base,
             &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>);
  if (local_50.base.sa_family != 2) {
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_50.base.sa_data[6];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_50.base.sa_data[7];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_50.base.sa_data[8];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_50.base.sa_data[9];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_50.base.sa_data[10];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_50.base.sa_data[0xb];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_50.base.sa_data[0xc];
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_50.base.sa_data[0xd];
    local_34.ipv6_address_.addr_.__in6_u._8_8_ = local_50._16_8_;
    local_34.ipv6_address_.scope_id_ = local_50.v6.sin6_scope_id;
    local_50.v6.sin6_flowinfo = 0;
  }
  else {
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_34.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_34.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_34.ipv6_address_.scope_id_ = 0;
  }
  local_34.type_ = (anon_enum_32)(local_50.base.sa_family != 2);
  local_34.ipv4_address_.addr_.s_addr = local_50.v4.sin_addr.s_addr;
  asio::ip::address::to_string_abi_cxx11_((string *)&local_88,&local_34);
  std::__cxx11::string::operator=((string *)&this->cached_address_,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            ((endpoint_type *)&local_88,
             &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>);
  this->cached_port_ = (uint)(ushort)(local_88._M_f._2_2_ << 8 | local_88._M_f._2_2_ >> 8);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&local_88,"session %lu got connection from %s:%u (as a server)",
                 this->session_id_,(this->cached_address_)._M_dataplus._M_p,
                 (ulong)this->cached_port_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"prepare_handshake",0x106,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  if (this->ssl_enabled_ == true) {
    local_88._M_f = (offset_in_rpc_session_to_subr)handle_handshake;
    local_88._8_8_ = 0;
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)
               &local_88._M_bound_args,
               &self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>);
    local_88._M_bound_args.
    super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_nuraft::rpc_session_*,_false>._M_head_impl = this;
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    async_handshake<std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>
              ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)
               &this->ssl_socket_,server,&local_88);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&local_88._M_bound_args.
                      super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                      .
                      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                      .super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>.
                      _M_head_impl + 8);
  }
  else {
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>);
    start(this,(ptr<rpc_session> *)&local_60);
    this_00 = &local_60._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void prepare_handshake() {
        // this is safe since we only expose ctor to cs_new
        ptr<rpc_session> self = this->shared_from_this();

        cached_address_ = socket_.remote_endpoint().address().to_string();
        cached_port_ = socket_.remote_endpoint().port();
        p_in( "session %" PRIu64 " got connection from %s:%u (as a server)",
              session_id_,
              cached_address_.c_str(),
              cached_port_ );

        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            ssl_socket_.async_handshake
                ( asio::ssl::stream_base::server,
                  std::bind( &rpc_session::handle_handshake,
                             this,
                             self,
                             std::placeholders::_1 ) );
#endif
        } else {
            this->start(self);
        }
    }